

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O3

void extratLightLine(int imageIndex,Mat *outputImage,structure_light *a)

{
  pointer pcVar1;
  Mat *this;
  pointer pcVar2;
  uint uVar3;
  long *plVar4;
  long lVar5;
  undefined8 uVar6;
  uint uVar7;
  size_type *psVar8;
  ulong uVar9;
  int in_R8D;
  uint __len;
  uint __val;
  Point maskPoint;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  allmaskPoint;
  undefined1 local_4e8 [16];
  undefined8 local_4d8;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> tempPointSet;
  string index;
  _InputArray local_498;
  string name2;
  string name1;
  string num;
  undefined1 local_418 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408 [6];
  Mat local_3a8 [96];
  Mat local_348 [144];
  Mat mask;
  undefined1 auStack_2b4 [12];
  _InputArray *p_Stack_2b0;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  Mat element2;
  undefined1 auStack_214 [12];
  _InputArray *p_Stack_210;
  Mat element1;
  Mat diff;
  Mat oriImage;
  undefined8 *local_b0;
  Mat lightImage;
  
  __val = -imageIndex;
  if (0 < imageIndex) {
    __val = imageIndex;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_001098b0;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_001098b0;
      }
      if (uVar7 < 10000) goto LAB_001098b0;
      uVar9 = uVar9 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_001098b0:
  num._M_dataplus._M_p = (pointer)&num.field_2;
  std::__cxx11::string::_M_construct((ulong)&num,(char)__len - (char)(imageIndex >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (num._M_dataplus._M_p + ((uint)imageIndex >> 0x1f),__len,__val);
  index._M_dataplus._M_p = (pointer)&index.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&index,".jpg","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
                 "./calib_picture/calib",&num);
  plVar4 = (long *)std::__cxx11::string::_M_append(local_418,(ulong)index._M_dataplus._M_p);
  name1._M_dataplus._M_p = (pointer)&name1.field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar8) {
    name1.field_2._M_allocated_capacity = *psVar8;
    name1.field_2._8_8_ = plVar4[3];
  }
  else {
    name1.field_2._M_allocated_capacity = *psVar8;
    name1._M_dataplus._M_p = (pointer)*plVar4;
  }
  name1._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  pcVar1 = local_418 + 0x10;
  if ((pointer)CONCAT44(local_418._4_4_,local_418._0_4_) != pcVar1) {
    operator_delete((pointer)CONCAT44(local_418._4_4_,local_418._0_4_));
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
                 "./light_picture/light",&num);
  plVar4 = (long *)std::__cxx11::string::_M_append(local_418,(ulong)index._M_dataplus._M_p);
  name2._M_dataplus._M_p = (pointer)&name2.field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar8) {
    name2.field_2._M_allocated_capacity = *psVar8;
    name2.field_2._8_8_ = plVar4[3];
  }
  else {
    name2.field_2._M_allocated_capacity = *psVar8;
    name2._M_dataplus._M_p = (pointer)*plVar4;
  }
  name2._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((pointer)CONCAT44(local_418._4_4_,local_418._0_4_) != pcVar1) {
    operator_delete((pointer)CONCAT44(local_418._4_4_,local_418._0_4_));
  }
  cv::imread((string *)&oriImage,(int)&name1);
  cv::imread((string *)&lightImage,(int)&name2);
  local_408[0]._M_allocated_capacity = 0;
  local_418._0_4_ = 0x1010000;
  _diff = 0x2010000;
  local_418._8_8_ = (pointer)&oriImage;
  cv::cvtColor((cv *)local_418,(_InputArray *)&diff,(_OutputArray *)0x6,0,in_R8D);
  local_408[0]._M_allocated_capacity = 0;
  local_418._0_4_ = 0x1010000;
  _diff = 0x2010000;
  local_418._8_8_ = (pointer)&lightImage;
  cv::cvtColor((cv *)local_418,(_InputArray *)&diff,(_OutputArray *)0x6,0,in_R8D);
  cv::Mat::Mat(&diff);
  local_408[0]._M_allocated_capacity = 0;
  local_418._0_4_ = 0x1010000;
  _element1 = 0x1010000;
  _element2 = 0x2010000;
  p_Stack_210 = (_InputArray *)&diff;
  local_418._8_8_ = (pointer)&oriImage;
  cv::absdiff((_InputArray *)local_418,(_InputArray *)&element1,(_OutputArray *)&element2);
  local_418._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"./save/diff.jpg","");
  _element1 = 0x1010000;
  _element2 = (undefined1  [16])0x0;
  cv::imwrite((string *)local_418,(_InputArray *)&element1,(vector *)&element2);
  if (_element2 != (Point_<float>)0x0) {
    operator_delete((void *)_element2);
  }
  if ((pointer)local_418._0_8_ != pcVar1) {
    operator_delete((void *)local_418._0_8_);
  }
  local_220 = 0x300000003;
  local_228 = 0xffffffffffffffff;
  cv::getStructuringElement(&element1,0);
  _element2 = 0x1010000;
  _mask = 0x2010000;
  p_Stack_2b0 = (_InputArray *)&diff;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x1010000;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&element1;
  local_230 = 0xffffffffffffffff;
  local_418._0_4_ = -1;
  local_418._4_4_ = 0x7fefffff;
  local_418._8_8_ = (pointer)0x7fefffffffffffff;
  local_408[0]._M_allocated_capacity = 0x7fefffffffffffff;
  local_408[0]._8_8_ = 0x7fefffffffffffff;
  cv::morphologyEx(&element2,&mask,2,&allmaskPoint,&local_230,1,0,(string *)local_418);
  local_418._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"./save/open.jpg","");
  _element2 = 0x1010000;
  _mask = (undefined1  [16])0x0;
  cv::imwrite((string *)local_418,(_InputArray *)&element2,(vector *)&mask);
  pcVar2 = (pointer)local_418._0_8_;
  if (_mask != (void *)0x0) {
    operator_delete(_mask);
    pcVar2 = (pointer)local_418._0_8_;
  }
  local_418._4_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
  if (pcVar2 != pcVar1) {
    local_418._0_8_ = pcVar2;
    operator_delete(pcVar2);
  }
  local_408[0]._M_allocated_capacity = 0;
  local_418._0_4_ = 0x1010000;
  _element2 = 0x2010000;
  local_418._8_8_ = (_InputArray *)&diff;
  cv::threshold((_InputArray *)local_418,(_OutputArray *)&element2,30.0,255.0,0);
  local_418._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"./save/threshold.jpg","");
  _element2 = 0x1010000;
  _mask = (undefined1  [16])0x0;
  cv::imwrite((string *)local_418,(_InputArray *)&element2,(vector *)&mask);
  if (_mask != (void *)0x0) {
    operator_delete(_mask);
  }
  if ((pointer)local_418._0_8_ != pcVar1) {
    operator_delete((void *)local_418._0_8_);
  }
  local_238 = 0x500000005;
  local_240 = 0xffffffffffffffff;
  cv::getStructuringElement((pointer)&element2,0);
  _mask = 0x1010000;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x2010000;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&diff;
  tempPointSet.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tempPointSet.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1010000;
  local_248 = 0xffffffffffffffff;
  local_418._0_4_ = -1;
  local_418._4_4_ = 0x7fefffff;
  local_418._8_8_ = (pointer)0x7fefffffffffffff;
  local_408[0]._M_allocated_capacity = 0x7fefffffffffffff;
  local_408[0]._8_8_ = 0x7fefffffffffffff;
  tempPointSet.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&element2;
  cv::erode();
  local_418._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"./save/erode.jpg","");
  _mask = 0x1010000;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cv::imwrite((string *)local_418,(_InputArray *)&mask,(vector *)&allmaskPoint);
  if (allmaskPoint.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(allmaskPoint.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_418._0_8_ != pcVar1) {
    operator_delete((void *)local_418._0_8_);
  }
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408[0]._M_allocated_capacity = 0;
  local_418._0_4_ = 0;
  local_418._4_4_ = 0;
  local_418._8_8_ = (pointer)0x0;
  std::
  vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
  ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
            ((vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
              *)&allmaskPoint,
             (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_418);
  if ((void *)CONCAT44(local_418._4_4_,local_418._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_418._4_4_,local_418._0_4_));
  }
  local_258 = CONCAT44((int)*local_b0,(int)((ulong)*local_b0 >> 0x20));
  cv::Mat::zeros(local_418,&local_258,0);
  cv::Mat::Mat(&mask);
  (**(code **)(*(long *)CONCAT44(local_418._4_4_,local_418._0_4_) + 0x18))
            ((long *)CONCAT44(local_418._4_4_,local_418._0_4_),local_418,&mask,0xffffffff);
  cv::Mat::~Mat(local_348);
  cv::Mat::~Mat(local_3a8);
  this = (Mat *)(local_418 + 0x10);
  cv::Mat::~Mat(this);
  maskPoint.x = 0;
  maskPoint.y = 0;
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            (&tempPointSet,
             (a->calibImagePoint).
             super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + imageIndex);
  maskPoint.y = (int)ROUND(((float *)
                           CONCAT44(tempPointSet.
                                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    tempPointSet.
                                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_))[1]);
  maskPoint.x = (int)ROUND(*(float *)CONCAT44(tempPointSet.
                                              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              tempPointSet.
                                              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_4_));
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
            (allmaskPoint.
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&maskPoint);
  lVar5 = (long)(a->patternSize).width;
  maskPoint.y = (int)ROUND(*(float *)(CONCAT44(tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) + -4
                                     + lVar5 * 8));
  maskPoint.x = (int)ROUND(*(float *)(CONCAT44(tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) + -8
                                     + lVar5 * 8));
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
            (allmaskPoint.
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&maskPoint);
  lVar5 = (long)(a->patternSize).height * (long)(a->patternSize).width;
  maskPoint.y = (int)ROUND(*(float *)(CONCAT44(tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) + -4
                                     + lVar5 * 8));
  maskPoint.x = (int)ROUND(*(float *)(CONCAT44(tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) + -8
                                     + lVar5 * 8));
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
            (allmaskPoint.
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&maskPoint);
  lVar5 = ((long)(a->patternSize).height + -1) * (long)(a->patternSize).width;
  maskPoint.y = (int)ROUND(*(float *)(CONCAT44(tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) + 4
                                     + lVar5 * 8));
  maskPoint.x = (int)ROUND(*(float *)(CONCAT44(tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                     lVar5 * 8));
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
            (allmaskPoint.
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&maskPoint);
  local_498.sz.width = 0;
  local_498.sz.height = 0;
  local_498.flags = 0x3010000;
  local_4d8 = 0;
  local_4e8._0_4_ = 0x8104000c;
  local_4e8._8_8_ =
       (vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
        *)&allmaskPoint;
  local_418._0_4_ = 0;
  local_418._4_4_ = 0x406fe000;
  local_418._8_8_ = (pointer)0x0;
  local_408[0]._M_allocated_capacity = 0;
  local_408[0]._8_8_ = 0;
  local_498.obj = &mask;
  uVar6 = cv::noArray();
  local_250 = 0;
  cv::drawContours(&local_498,local_4e8,0,local_418,0xffffffff,8,uVar6,0x7fffffff,&local_250);
  local_408[0]._M_allocated_capacity = 0;
  local_418._0_4_ = 0x2010000;
  local_498.sz.width = 0;
  local_498.sz.height = 0;
  local_498.flags = 0x1010000;
  local_498.obj = &mask;
  local_418._8_8_ = outputImage;
  cv::Mat::copyTo((_OutputArray *)&diff,(_InputArray *)local_418);
  local_418._0_8_ = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"./save/mask.jpg","");
  local_498.sz.width = 0;
  local_498.sz.height = 0;
  local_498.flags = 0x1010000;
  local_4d8 = 0;
  local_4e8 = (undefined1  [16])0x0;
  local_498.obj = &mask;
  cv::imwrite((string *)local_418,&local_498,(vector *)local_4e8);
  if ((void *)local_4e8._0_8_ != (void *)0x0) {
    operator_delete((void *)local_4e8._0_8_);
  }
  if ((Mat *)local_418._0_8_ != this) {
    operator_delete((void *)local_418._0_8_);
  }
  local_418._0_8_ = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"./save/ROI.jpg","");
  local_498.sz.width = 0;
  local_498.sz.height = 0;
  local_498.flags = 0x1010000;
  local_4d8 = 0;
  local_4e8 = (undefined1  [16])0x0;
  local_498.obj = outputImage;
  cv::imwrite((string *)local_418,&local_498,(vector *)local_4e8);
  if ((void *)local_4e8._0_8_ != (void *)0x0) {
    operator_delete((void *)local_4e8._0_8_);
  }
  if ((Mat *)local_418._0_8_ != this) {
    operator_delete((void *)local_418._0_8_);
  }
  if ((void *)CONCAT44(tempPointSet.
                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       tempPointSet.
                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(tempPointSet.
                                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     tempPointSet.
                                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  cv::Mat::~Mat(&mask);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&allmaskPoint);
  cv::Mat::~Mat(&element2);
  cv::Mat::~Mat(&element1);
  cv::Mat::~Mat(&diff);
  cv::Mat::~Mat(&lightImage);
  cv::Mat::~Mat(&oriImage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name2._M_dataplus._M_p != &name2.field_2) {
    operator_delete(name2._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name1._M_dataplus._M_p != &name1.field_2) {
    operator_delete(name1._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)index._M_dataplus._M_p != &index.field_2) {
    operator_delete(index._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)num._M_dataplus._M_p != &num.field_2) {
    operator_delete(num._M_dataplus._M_p);
  }
  return;
}

Assistant:

void extratLightLine(int imageIndex, Mat &outputImage, structure_light &a)
{
    string num = to_string(imageIndex);
    string index = ".jpg";
    string name1 = "./calib_picture/calib" + num + index;
    string name2 = "./light_picture/light" + num + index;

    Mat oriImage = imread(name1);
    Mat lightImage = imread(name2);

    cvtColor(oriImage, oriImage, COLOR_BGR2GRAY);
    cvtColor(lightImage, lightImage, COLOR_BGR2GRAY);
    Mat diff;
    absdiff(oriImage, lightImage, diff);
    imwrite("./save/diff.jpg", diff);

    Mat element1 = getStructuringElement(MORPH_RECT, Size(3, 3));
    morphologyEx(diff, diff, MORPH_OPEN, element1);
    imwrite("./save/open.jpg", diff);

    threshold(diff, diff, 30, 255, THRESH_BINARY);
    imwrite("./save/threshold.jpg", diff);

    Mat element2 = getStructuringElement(MORPH_RECT, Size(5, 5));
    erode(diff, diff, element2);
    imwrite("./save/erode.jpg", diff);

    vector<vector<Point>>  allmaskPoint;
    allmaskPoint.push_back(vector<Point>());
    Mat mask = Mat::zeros(oriImage.size(), CV_8UC1);
    Point2f tempPoint;
    Point maskPoint;
    vector<Point2f> tempPointSet = a.calibImagePoint[imageIndex];
    vector<Point2f> maskPointSet;

    tempPoint = tempPointSet[0];
    maskPoint.x = cvRound(tempPoint.x);
    maskPoint.y = cvRound(tempPoint.y);
    allmaskPoint[0].push_back(maskPoint);

    tempPoint = tempPointSet[a.patternSize.width - 1];
    maskPoint.x = cvRound(tempPoint.x);
    maskPoint.y = cvRound(tempPoint.y);
    allmaskPoint[0].push_back(maskPoint);

    tempPoint = tempPointSet[a.patternSize.width*a.patternSize.height - 1];
    maskPoint.x = cvRound(tempPoint.x);
    maskPoint.y = cvRound(tempPoint.y);
    allmaskPoint[0].push_back(maskPoint);

    tempPoint = tempPointSet[a.patternSize.width*(a.patternSize.height - 1)];
    maskPoint.x = cvRound(tempPoint.x);
    maskPoint.y = cvRound(tempPoint.y);
    allmaskPoint[0].push_back(maskPoint);

    drawContours(mask, allmaskPoint, 0, Scalar(255), FILLED, 8);
    diff.copyTo(outputImage, mask);
    imwrite("./save/mask.jpg", mask);
    imwrite("./save/ROI.jpg", outputImage);

}